

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Erase(ExtensionSet *this,int key)

{
  bool bVar1;
  KeyValue *__last;
  KeyValue *local_28;
  KeyValue *it;
  KeyValue *end;
  ExtensionSet *pEStack_10;
  int key_local;
  ExtensionSet *this_local;
  
  end._4_4_ = key;
  pEStack_10 = this;
  bVar1 = is_large(this);
  if (bVar1) {
    absl::lts_20250127::container_internal::
    btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
    ::erase<int>((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                  *)(this->map_).flat,(key_arg<int> *)((long)&end + 4));
  }
  else {
    __last = flat_end(this);
    local_28 = flat_begin(this);
    while( true ) {
      bVar1 = false;
      if (local_28 != __last) {
        bVar1 = local_28->first <= end._4_4_;
      }
      if (!bVar1) {
        return;
      }
      if (local_28->first == end._4_4_) break;
      local_28 = local_28 + 1;
    }
    std::
    copy<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue*>
              (local_28 + 1,__last,local_28);
    this->flat_size_ = this->flat_size_ - 1;
  }
  return;
}

Assistant:

void ExtensionSet::Erase(int key) {
  if (ABSL_PREDICT_FALSE(is_large())) {
    map_.large->erase(key);
    return;
  }
  KeyValue* end = flat_end();
  for (KeyValue* it = flat_begin(); it != end && it->first <= key; ++it) {
    if (it->first == key) {
      std::copy(it + 1, end, it);
      --flat_size_;
      return;
    }
  }
}